

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O3

void __thiscall
QUrlModel::setUrl(QUrlModel *this,QModelIndex *index,QUrl *url,QModelIndex *dirIndex)

{
  QList<QUrl> *this_00;
  QAbstractItemModel *pQVar1;
  QSize QVar2;
  storage_type_conflict *psVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char cVar7;
  int iVar9;
  bool bVar6;
  byte bVar8;
  QIconPrivate *__old_val;
  long *plVar10;
  QMetaType QVar11;
  long lVar12;
  long lVar13;
  QSize *pQVar14;
  QIconPrivate *pQVar15;
  Mode MVar16;
  anon_union_24_3_e3d07ef4_for_data *paVar17;
  long in_FS_OFFSET;
  double dVar18;
  QStringView QVar19;
  QStringView QVar20;
  QIcon oldIcon;
  QIcon newIcon;
  QIcon local_c0;
  QSize local_b8;
  QMetaType local_b0 [3];
  QSize local_98;
  storage_type_conflict *psStack_90;
  undefined1 *local_88;
  QSize local_78;
  storage_type_conflict *psStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  ulong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ::QVariant::QVariant((QVariant *)&local_58,url);
  (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x101);
  ::QVariant::~QVariant((QVariant *)&local_58);
  paVar17 = &local_58;
  QUrl::path(paVar17,url,0x7f00000);
  uVar4 = local_58._16_8_;
  if ((InterfaceType *)local_58.shared != (InterfaceType *)0x0) {
    LOCK();
    *(int *)local_58.shared = *(int *)local_58.shared + -1;
    UNLOCK();
    if (*(int *)local_58.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
    }
  }
  if ((undefined1 *)uVar4 == (undefined1 *)0x0) {
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
    ::QVariant::~QVariant((QVariant *)&local_58);
    QFileSystemModel::myComputer((int)&local_58);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    local_78.wd.m_i = 0;
    local_78.ht.m_i = 0;
    psStack_70 = (storage_type_conflict *)0x0;
    local_68 = (undefined1 *)0x0;
    if (this->showFullPath == true) {
      pQVar1 = (dirIndex->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = (undefined1 *)0x0;
        local_40 = 2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,0x101);
      }
      ::QVariant::toString();
      QDir::toNativeSeparators((QString *)&local_98);
      psStack_70 = psStack_90;
      local_78 = local_98;
      local_98.wd.m_i = 0;
      local_98.ht.m_i = 0;
      psStack_90 = (storage_type_conflict *)0x0;
      local_68 = local_88;
      local_88 = (undefined1 *)0x0;
      if (local_b0[0].d_ptr != (QMetaTypeInterface *)0x0) {
        LOCK();
        *(int *)local_b0[0].d_ptr = *(int *)local_b0[0].d_ptr + -1;
        iVar9._0_2_ = (local_b0[0].d_ptr)->revision;
        iVar9._2_2_ = (local_b0[0].d_ptr)->alignment;
        UNLOCK();
        if (iVar9 == 0) {
          QArrayData::deallocate((QArrayData *)local_b0[0].d_ptr,2,0x10);
        }
      }
    }
    else {
      pQVar1 = (dirIndex->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = (storage_type_conflict *)0x0;
        local_58._16_8_ = (undefined1 *)0x0;
        local_40 = 2;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,0);
      }
      ::QVariant::toString();
      psStack_70 = psStack_90;
      local_78 = local_98;
      local_98.wd.m_i = 0;
      local_98.ht.m_i = 0;
      psStack_90 = (storage_type_conflict *)0x0;
      local_68 = local_88;
      local_88 = (undefined1 *)0x0;
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    local_b8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (dirIndex->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
      local_b0[0].d_ptr = (QMetaTypeInterface *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,dirIndex,1);
      local_b0[0].d_ptr = (QMetaTypeInterface *)(local_40 & 0xfffffffffffffffc);
    }
    local_98 = (QSize)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    bVar6 = comparesEqual(local_b0,(QMetaType *)&local_98);
    uVar4 = local_58.shared;
    if (bVar6) {
      if ((local_40 & 1) == 0) {
        local_58.shared = (PrivateShared *)0x0;
        local_b8 = (QSize)uVar4;
      }
      else {
        pQVar14 = (QSize *)(local_58.shared + *(int *)(local_58.shared + 4));
        if (*(int *)local_58.shared == 1) {
          local_b8 = *pQVar14;
          pQVar14->wd = 0;
          pQVar14->ht = 0;
        }
        else {
          QIcon::QIcon((QIcon *)&local_b8,(QIcon *)pQVar14);
        }
      }
    }
    else {
      local_b8 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon((QIcon *)&local_b8);
      QVar11.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar17 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar11,paVar17,(QMetaType)local_98,&local_b8);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    if (((dirIndex->r < 0) || (dirIndex->c < 0)) || ((dirIndex->m).ptr == (QAbstractItemModel *)0x0)
       ) {
      plVar10 = (long *)QFileSystemModel::iconProvider();
      if (plVar10 != (long *)0x0) {
        (**(code **)(*plVar10 + 0x10))(&local_98,plVar10,5);
        QVar2 = local_98;
        local_58.shared = (PrivateShared *)local_b8;
        local_98.wd.m_i = 0;
        local_98.ht.m_i = 0;
        local_b8 = QVar2;
        QIcon::~QIcon((QIcon *)&local_58.shared);
        QIcon::~QIcon((QIcon *)&local_98);
      }
      QUrl::toLocalFile();
      QFileInfo::QFileInfo((QFileInfo *)local_b0,(QString *)&local_98);
      QFileInfo::fileName();
      uVar5 = local_58._16_8_;
      uVar4 = local_58.shared;
      psVar3 = psStack_70;
      QVar2 = local_78;
      local_58.shared = (PrivateShared *)local_78;
      local_78 = (QSize)uVar4;
      psStack_70 = (storage_type_conflict *)local_58._8_8_;
      local_58._8_8_ = psVar3;
      local_58._16_8_ = local_68;
      local_68 = (undefined1 *)uVar5;
      if (QVar2 != (QSize)0x0) {
        LOCK();
        *(int *)QVar2 = *(int *)QVar2 + -1;
        UNLOCK();
        if (*(int *)QVar2 == 0) {
          QArrayData::deallocate((QArrayData *)QVar2,2,0x10);
        }
      }
      QFileInfo::~QFileInfo((QFileInfo *)local_b0);
      if (local_98 != (QSize)0x0) {
        LOCK();
        *(int *)local_98 = *(int *)local_98 + -1;
        UNLOCK();
        if (*(int *)local_98 == 0) {
          QArrayData::deallocate((QArrayData *)local_98,2,0x10);
        }
      }
      this_00 = &this->invalidUrls;
      bVar6 = QListSpecialMethodsBase<QUrl>::contains<QUrl>
                        ((QListSpecialMethodsBase<QUrl> *)this_00,url);
      if (!bVar6) {
        QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl_const&>
                  ((QMovableArrayOps<QUrl> *)this_00,(this->invalidUrls).d.size,url);
        QList<QUrl>::end(this_00);
      }
      bVar6 = false;
    }
    else {
      bVar6 = true;
    }
    ::QVariant::QVariant((QVariant *)&local_58,bVar6);
    (**(code **)(*(long *)this + 0x98))(this,index,&local_58,0x102);
    ::QVariant::~QVariant((QVariant *)&local_58);
    cVar7 = QIcon::isNull();
    if (cVar7 == '\0') {
      local_58.shared = (PrivateShared *)0x2000000020;
      iVar9 = QIcon::actualSize(&local_b8,(Mode)&local_58,On);
      if (iVar9 < 0x20) {
        lVar12 = *(long *)(*(long *)&this->field_0x8 + 0x10);
        if ((lVar12 == 0) || ((*(byte *)(*(long *)(lVar12 + 8) + 0x30) & 1) == 0)) {
          dVar18 = (double)QGuiApplication::devicePixelRatio();
        }
        else {
          dVar18 = (double)QPaintDevice::devicePixelRatio();
        }
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.wd.m_i = 0x20;
        local_98.ht.m_i = 0x20;
        QIcon::pixmap((QSize *)&local_58.shared,dVar18,(Mode)&local_b8,(State)&local_98);
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
        psStack_90 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        MVar16 = (Mode)&local_98;
        QPixmap::scaledToWidth(MVar16,(TransformationMode)&local_58);
        QIcon::addPixmap((QPixmap *)&local_b8,MVar16,On);
        QPixmap::~QPixmap((QPixmap *)&local_98);
        QPixmap::~QPixmap((QPixmap *)local_58.data);
      }
    }
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,0);
    }
    ::QVariant::toString();
    bVar8 = 1;
    if (local_88 == local_68) {
      QVar19.m_data = psStack_90;
      QVar19.m_size = (qsizetype)local_88;
      QVar20.m_data = psStack_70;
      QVar20.m_size = (qsizetype)local_88;
      bVar8 = QtPrivate::equalStrings(QVar19,QVar20);
      bVar8 = bVar8 ^ 1;
    }
    if (local_98 != (QSize)0x0) {
      LOCK();
      *(int *)local_98 = *(int *)local_98 + -1;
      UNLOCK();
      if (*(int *)local_98 == 0) {
        QArrayData::deallocate((QArrayData *)local_98,2,0x10);
      }
    }
    paVar17 = &local_58;
    ::QVariant::~QVariant((QVariant *)paVar17);
    if (bVar8 != 0) {
      ::QVariant::QVariant((QVariant *)&local_58,(QString *)&local_78);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,2);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    local_c0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar1 = (index->m).ptr;
    if (pQVar1 == (QAbstractItemModel *)0x0) {
      local_58.shared = (PrivateShared *)0x0;
      local_58._8_8_ = (storage_type_conflict *)0x0;
      local_58._16_8_ = (undefined1 *)0x0;
      local_40 = 2;
      local_b0[0].d_ptr = (QMetaTypeInterface *)0x0;
    }
    else {
      (**(code **)(*(long *)pQVar1 + 0x90))(&local_58,pQVar1,index,1);
      local_b0[0].d_ptr = (QMetaTypeInterface *)(local_40 & 0xfffffffffffffffc);
    }
    local_98 = (QSize)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    bVar6 = comparesEqual(local_b0,(QMetaType *)&local_98);
    uVar4 = local_58.shared;
    if (bVar6) {
      if ((local_40 & 1) == 0) {
        local_58.shared = (PrivateShared *)0x0;
        local_c0.d = (QIconPrivate *)uVar4;
      }
      else {
        pQVar15 = (QIconPrivate *)(local_58.shared + *(int *)(local_58.shared + 4));
        if (*(int *)local_58.shared == 1) {
          local_c0.d = *(QIconPrivate **)pQVar15;
          *(undefined8 *)pQVar15 = 0;
        }
        else {
          QIcon::QIcon(&local_c0,(QIcon *)pQVar15);
        }
      }
    }
    else {
      local_c0.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon(&local_c0);
      QVar11.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((local_40 & 1) != 0) {
        paVar17 = (anon_union_24_3_e3d07ef4_for_data *)
                  (local_58.shared + *(int *)(local_58.shared + 4));
      }
      QMetaType::convert(QVar11,paVar17,(QMetaType)local_98,&local_c0);
    }
    ::QVariant::~QVariant((QVariant *)&local_58);
    lVar12 = QIcon::cacheKey();
    lVar13 = QIcon::cacheKey();
    if (lVar12 != lVar13) {
      QIcon::operator_cast_to_QVariant((QVariant *)&local_58,(QIcon *)&local_b8);
      (**(code **)(*(long *)this + 0x98))(this,index,&local_58,1);
      ::QVariant::~QVariant((QVariant *)&local_58);
    }
    QIcon::~QIcon(&local_c0);
    QIcon::~QIcon((QIcon *)&local_b8);
    if (local_78 != (QSize)0x0) {
      LOCK();
      *(int *)local_78 = *(int *)local_78 + -1;
      UNLOCK();
      if (*(int *)local_78 == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::setUrl(const QModelIndex &index, const QUrl &url, const QModelIndex &dirIndex)
{
    setData(index, url, UrlRole);
    if (url.path().isEmpty()) {
        setData(index, fileSystemModel->myComputer());
        setData(index, fileSystemModel->myComputer(Qt::DecorationRole), Qt::DecorationRole);
    } else {
        QString newName;
        if (showFullPath) {
            //On windows the popup display the "C:\", convert to nativeSeparators
            newName = QDir::toNativeSeparators(dirIndex.data(QFileSystemModel::FilePathRole).toString());
        } else {
            newName = dirIndex.data().toString();
        }

        QIcon newIcon = qvariant_cast<QIcon>(dirIndex.data(Qt::DecorationRole));
        if (!dirIndex.isValid()) {
            const QAbstractFileIconProvider *provider = fileSystemModel->iconProvider();
            if (provider)
                newIcon = provider->icon(QAbstractFileIconProvider::Folder);
            newName = QFileInfo(url.toLocalFile()).fileName();
            if (!invalidUrls.contains(url))
                invalidUrls.append(url);
            //The bookmark is invalid then we set to false the EnabledRole
            setData(index, false, EnabledRole);
        } else {
            //The bookmark is valid then we set to true the EnabledRole
            setData(index, true, EnabledRole);
        }

        // newIcon could be null if fileSystemModel->iconProvider() returns null
        if (!newIcon.isNull()) {
        // Make sure that we have at least 32x32 images
            const QSize size = newIcon.actualSize(QSize(32,32));
            if (size.width() < 32) {
                const auto widget = qobject_cast<QWidget *>(parent());
                const auto dpr = widget ? widget->devicePixelRatio() : qApp->devicePixelRatio();
                const auto smallPixmap = newIcon.pixmap(QSize(32, 32), dpr);
                const auto newPixmap = smallPixmap.scaledToWidth(32 * dpr, Qt::SmoothTransformation);
                newIcon.addPixmap(newPixmap);
            }
        }

        if (index.data().toString() != newName)
            setData(index, newName);
        QIcon oldIcon = qvariant_cast<QIcon>(index.data(Qt::DecorationRole));
        if (oldIcon.cacheKey() != newIcon.cacheKey())
            setData(index, newIcon, Qt::DecorationRole);
    }
}